

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute __thiscall
pugi::xml_node::insert_attribute_before(xml_node *this,char_t *name_,xml_attribute *attr)

{
  bool bVar1;
  xml_node_type xVar2;
  xml_allocator *alloc;
  xml_attribute_struct *attr_00;
  xml_attribute local_38;
  xml_attribute a;
  xml_attribute_struct *cur;
  xml_attribute *attr_local;
  char_t *name__local;
  xml_node *this_local;
  
  xVar2 = type(this);
  if (((xVar2 != node_element) && (xVar2 = type(this), xVar2 != node_declaration)) ||
     (bVar1 = xml_attribute::empty(attr), bVar1)) {
    xml_attribute::xml_attribute((xml_attribute *)&this_local);
    return (xml_attribute)(xml_attribute_struct *)this_local;
  }
  a = (xml_attribute)attr->_attr;
  while ((a._attr)->prev_attribute_c->next_attribute != (xml_attribute_struct *)0x0) {
    a._attr = (a._attr)->prev_attribute_c;
  }
  if (a._attr != this->_root->first_attribute) {
    xml_attribute::xml_attribute((xml_attribute *)&this_local);
    return (xml_attribute)(xml_attribute_struct *)this_local;
  }
  alloc = impl::anon_unknown_0::get_allocator(this->_root);
  attr_00 = impl::anon_unknown_0::allocate_attribute(alloc);
  xml_attribute::xml_attribute(&local_38,attr_00);
  bVar1 = xml_attribute::operator!(&local_38);
  if (!bVar1) {
    xml_attribute::set_name(&local_38,name_);
    if (attr->_attr->prev_attribute_c->next_attribute == (xml_attribute_struct *)0x0) {
      this->_root->first_attribute = local_38._attr;
    }
    else {
      attr->_attr->prev_attribute_c->next_attribute = local_38._attr;
    }
    (local_38._attr)->prev_attribute_c = attr->_attr->prev_attribute_c;
    (local_38._attr)->next_attribute = attr->_attr;
    attr->_attr->prev_attribute_c = local_38._attr;
    return (xml_attribute)local_38._attr;
  }
  xml_attribute::xml_attribute((xml_attribute *)&this_local);
  return (xml_attribute)(xml_attribute_struct *)this_local;
}

Assistant:

PUGI__FN xml_attribute xml_node::insert_attribute_before(const char_t* name_, const xml_attribute& attr)
	{
		if ((type() != node_element && type() != node_declaration) || attr.empty()) return xml_attribute();
		
		// check that attribute belongs to *this
		xml_attribute_struct* cur = attr._attr;

		while (cur->prev_attribute_c->next_attribute) cur = cur->prev_attribute_c;

		if (cur != _root->first_attribute) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(impl::get_allocator(_root)));
		if (!a) return xml_attribute();

		a.set_name(name_);

		if (attr._attr->prev_attribute_c->next_attribute)
			attr._attr->prev_attribute_c->next_attribute = a._attr;
		else
			_root->first_attribute = a._attr;
		
		a._attr->prev_attribute_c = attr._attr->prev_attribute_c;
		a._attr->next_attribute = attr._attr;
		attr._attr->prev_attribute_c = a._attr;
				
		return a;
	}